

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

double benchmark_processing<boost::poly_collection::base_collection<A,std::allocator<A>>>
                 (size_t num_elems)

{
  uint uVar1;
  size_type sVar2;
  double dVar3;
  undefined1 auVar4 [16];
  time_point start;
  uniform_int_distribution<int> rnd_type;
  uniform_real_distribution<double> local_1de8;
  base_collection<A,_std::allocator<A>_> container;
  random_device rd;
  mt19937_64 gen;
  
  container.super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>
  .map.map._M_h._M_buckets =
       &container.
        super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map
        .map._M_h._M_single_bucket;
  container.super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>
  .map.map._M_h._M_bucket_count = 1;
  container.super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>
  .map.map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  container.super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>
  .map.map._M_h._M_element_count = 0;
  container.super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>
  .map.map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  container.super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>
  .map.map._M_h._M_rehash_policy._M_next_resize = 0;
  container.super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>
  .map.map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  container.super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>
  .map.cache._M_h._M_buckets =
       &container.
        super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>.map
        .cache._M_h._M_single_bucket;
  container.super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>
  .map.cache._M_h._M_bucket_count = 1;
  container.super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>
  .map.cache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  container.super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>
  .map.cache._M_h._M_element_count = 0;
  container.super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>
  .map.cache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  container.super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>
  .map.cache._M_h._M_rehash_policy._M_next_resize = 0;
  container.super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>
  .map.cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::random_device::random_device(&rd);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&gen,(ulong)uVar1);
  rnd_type._M_param._M_a = 0;
  rnd_type._M_param._M_b = 5;
  local_1de8._M_param._M_a = 0.0;
  local_1de8._M_param._M_b = 100000.0;
  random_fill<boost::poly_collection::base_collection<A,std::allocator<A>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_int_distribution<int>,std::uniform_real_distribution<double>>
            (&container,&gen,&rnd_type,&local_1de8,num_elems);
  start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  process<A>(&container);
  dVar3 = toc(&start);
  sVar2 = boost::poly_collection::common_impl::
          poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>::size
                    (&container.
                      super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>
                    );
  do_not_optimize_out<A>
            ((base_collection<A,_std::allocator<A>_> *)
             &container.
              super_poly_collection<boost::poly_collection::detail::base_model<A>,_std::allocator<A>_>
            );
  auVar4._8_4_ = (int)(sVar2 >> 0x20);
  auVar4._0_8_ = sVar2;
  auVar4._12_4_ = 0x45300000;
  std::random_device::~random_device(&rd);
  boost::poly_collection::detail::
  type_info_map<boost::poly_collection::detail::segment<boost::poly_collection::detail::base_model<A>,_boost::poly_collection::detail::allocator_adaptor<std::allocator<A>_>_>,_boost::poly_collection::detail::allocator_adaptor<std::allocator<boost::poly_collection::detail::segment<boost::poly_collection::detail::base_model<A>,_boost::poly_collection::detail::allocator_adaptor<std::allocator<A>_>_>_>_>_>
  ::~type_info_map((type_info_map<boost::poly_collection::detail::segment<boost::poly_collection::detail::base_model<A>,_boost::poly_collection::detail::allocator_adaptor<std::allocator<A>_>_>,_boost::poly_collection::detail::allocator_adaptor<std::allocator<boost::poly_collection::detail::segment<boost::poly_collection::detail::base_model<A>,_boost::poly_collection::detail::allocator_adaptor<std::allocator<A>_>_>_>_>_>
                    *)&container);
  return dVar3 / ((auVar4._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
}

Assistant:

double benchmark_processing( std::size_t num_elems)
{
	Cont container;

        //std::cout << "p";
        std::random_device rd;
        std::mt19937_64					gen(rd());
	std::uniform_int_distribution<>			rnd_type(0, 5 );
	std::uniform_real_distribution<double>	rnd_value(0, 100000);
	random_fill(container, gen, rnd_type, rnd_value, num_elems);

	auto start = tic();
	{
		process(container);
	}
	double t = toc(start);
	double duration = t / container.size();
	do_not_optimize_out(container);

	return duration;
}